

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<kj::Promise<int>_> * __thiscall
kj::arr<kj::Promise<int>,kj::Promise<int>>
          (Array<kj::Promise<int>_> *__return_storage_ptr__,kj *this,Promise<int> *param1,
          Promise<int> *params)

{
  Promise<int> *pPVar1;
  Array<kj::Promise<int>_> *result;
  ArrayBuilder<kj::Promise<int>_> local_38;
  
  pPVar1 = _::HeapArrayDisposer::allocateUninitialized<kj::Promise<int>>(2);
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  (pPVar1->super_PromiseBase).node.ptr = *(PromiseNode **)this;
  *(undefined8 *)this = 0;
  pPVar1[1].super_PromiseBase.node.ptr = (param1->super_PromiseBase).node.ptr;
  (param1->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
  __return_storage_ptr__->ptr = pPVar1;
  __return_storage_ptr__->size_ = 2;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_38.ptr = (Promise<int> *)0x0;
  local_38.pos = (RemoveConst<kj::Promise<int>_> *)0x0;
  local_38.endPtr = (Promise<int> *)0x0;
  ArrayBuilder<kj::Promise<int>_>::dispose(&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline Array<Decay<T>> arr(T&& param1, Params&&... params) {
  ArrayBuilder<Decay<T>> builder = heapArrayBuilder<Decay<T>>(sizeof...(params) + 1);
  (builder.add(kj::fwd<T>(param1)), ... , builder.add(kj::fwd<Params>(params)));
  return builder.finish();
}